

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode http_req_complete(Curl_easy *data,dynbuf *r,int httpversion,Curl_HttpReq httpreq)

{
  char *pcVar1;
  undefined8 *local_48;
  curl_slist *hdr;
  curl_off_t cStack_38;
  _Bool announced_exp100;
  curl_off_t req_clen;
  Curl_HttpReq local_28;
  CURLcode result;
  Curl_HttpReq httpreq_local;
  int httpversion_local;
  dynbuf *r_local;
  Curl_easy *data_local;
  
  req_clen._4_4_ = CURLE_OK;
  hdr._7_1_ = 0;
  local_28 = httpreq;
  result = httpversion;
  _httpreq_local = r;
  r_local = (dynbuf *)data;
  if (((*(uint *)&(data->req).field_0xd9 >> 0xf & 1) != 0) &&
     (req_clen._4_4_ = Curl_httpchunk_add_reader(data), req_clen._4_4_ != CURLE_OK)) {
    return req_clen._4_4_;
  }
  cStack_38 = Curl_creader_total_length((Curl_easy *)r_local);
  if (local_28 - HTTPREQ_POST < 4) {
    if (((-1 < cStack_38) && ((*(uint *)((long)&r_local[0xc].toobig + 1) >> 0xf & 1) == 0)) &&
       (((*(uint *)((long)&r_local[0xc].toobig + 1) >> 0x12 & 1) != 0 ||
        (pcVar1 = Curl_checkheaders((Curl_easy *)r_local,"Content-Length",0xe),
        pcVar1 == (char *)0x0)))) {
      req_clen._4_4_ = Curl_dyn_addf(_httpreq_local,"Content-Length: %ld\r\n",cStack_38);
    }
    if (req_clen._4_4_ != CURLE_OK) goto LAB_0015150a;
    if ((r_local[0x92].leng != 0) &&
       ((local_28 == HTTPREQ_POST_FORM || (local_28 == HTTPREQ_POST_MIME)))) {
      for (local_48 = *(undefined8 **)(r_local[0x92].leng + 0x48); local_48 != (undefined8 *)0x0;
          local_48 = (undefined8 *)local_48[1]) {
        req_clen._4_4_ = Curl_dyn_addf(_httpreq_local,"%s\r\n",*local_48);
        if (req_clen._4_4_ != CURLE_OK) goto LAB_0015150a;
        req_clen._4_4_ = CURLE_OK;
      }
    }
    if ((local_28 == HTTPREQ_POST) &&
       (pcVar1 = Curl_checkheaders((Curl_easy *)r_local,"Content-Type",0xc), pcVar1 == (char *)0x0))
    {
      req_clen._4_4_ =
           Curl_dyn_addn(_httpreq_local,"Content-Type: application/x-www-form-urlencoded\r\n",0x31);
      if (req_clen._4_4_ != CURLE_OK) goto LAB_0015150a;
      req_clen._4_4_ = CURLE_OK;
    }
    req_clen._4_4_ = addexpect((Curl_easy *)r_local,_httpreq_local,result,(_Bool *)((long)&hdr + 7))
    ;
    if (req_clen._4_4_ != CURLE_OK) goto LAB_0015150a;
    req_clen._4_4_ = CURLE_OK;
  }
  req_clen._4_4_ = Curl_dyn_addn(_httpreq_local,"\r\n",2);
  if ((req_clen._4_4_ == CURLE_OK) &&
     (Curl_pgrsSetUploadSize((Curl_easy *)r_local,cStack_38), (hdr._7_1_ & 1) != 0)) {
    req_clen._4_4_ = http_exp100_add_reader((Curl_easy *)r_local);
  }
LAB_0015150a:
  if (req_clen._4_4_ == CURLE_OK) {
    Curl_xfer_setup1((Curl_easy *)r_local,3,-1,true);
  }
  return req_clen._4_4_;
}

Assistant:

static CURLcode http_req_complete(struct Curl_easy *data,
                                  struct dynbuf *r, int httpversion,
                                  Curl_HttpReq httpreq)
{
  CURLcode result = CURLE_OK;
  curl_off_t req_clen;
  bool announced_exp100 = FALSE;

  DEBUGASSERT(data->conn);
  if(data->req.upload_chunky) {
    result = Curl_httpchunk_add_reader(data);
    if(result)
      return result;
  }

  /* Get the request body length that has been set up */
  req_clen = Curl_creader_total_length(data);
  switch(httpreq) {
  case HTTPREQ_PUT:
  case HTTPREQ_POST:
#if !defined(CURL_DISABLE_MIME) || !defined(CURL_DISABLE_FORM_API)
  case HTTPREQ_POST_FORM:
  case HTTPREQ_POST_MIME:
#endif
    /* We only set Content-Length and allow a custom Content-Length if
       we do not upload data chunked, as RFC2616 forbids us to set both
       kinds of headers (Transfer-Encoding: chunked and Content-Length).
       We do not override a custom "Content-Length" header, but during
       authentication negotiation that header is suppressed.
     */
    if(req_clen >= 0 && !data->req.upload_chunky &&
       (data->req.authneg ||
        !Curl_checkheaders(data, STRCONST("Content-Length")))) {
      /* we allow replacing this header if not during auth negotiation,
         although it is not very wise to actually set your own */
      result = Curl_dyn_addf(r, "Content-Length: %" FMT_OFF_T "\r\n",
                             req_clen);
    }
    if(result)
      goto out;

#ifndef CURL_DISABLE_MIME
    /* Output mime-generated headers. */
    if(data->state.mimepost &&
       ((httpreq == HTTPREQ_POST_FORM) || (httpreq == HTTPREQ_POST_MIME))) {
      struct curl_slist *hdr;

      for(hdr = data->state.mimepost->curlheaders; hdr; hdr = hdr->next) {
        result = Curl_dyn_addf(r, "%s\r\n", hdr->data);
        if(result)
          goto out;
      }
    }
#endif
    if(httpreq == HTTPREQ_POST) {
      if(!Curl_checkheaders(data, STRCONST("Content-Type"))) {
        result = Curl_dyn_addn(r, STRCONST("Content-Type: application/"
                                           "x-www-form-urlencoded\r\n"));
        if(result)
          goto out;
      }
    }
    result = addexpect(data, r, httpversion, &announced_exp100);
    if(result)
      goto out;
    break;
  default:
    break;
  }

  /* end of headers */
  result = Curl_dyn_addn(r, STRCONST("\r\n"));
  if(!result) {
    Curl_pgrsSetUploadSize(data, req_clen);
    if(announced_exp100)
      result = http_exp100_add_reader(data);
  }

out:
  if(!result) {
    /* setup variables for the upcoming transfer */
    Curl_xfer_setup1(data, CURL_XFER_SENDRECV, -1, TRUE);
  }
  return result;
}